

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall
IRBuilder::BuildProfiledReg1Unsigned1
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot R0,int32 C1,ProfileId profileId)

{
  undefined1 *puVar1;
  uint uVar2;
  StackSym *pSVar3;
  code *pcVar4;
  bool bVar5;
  ValueType VVar6;
  undefined4 *puVar7;
  RegOpnd *pRVar8;
  Opnd *src2Opnd;
  ProfiledInstr *pPVar9;
  ProfiledInstr *pPVar10;
  IntConstOpnd *src1Opnd;
  JitProfilingInstr *this_00;
  JitProfilingInstr *pJVar11;
  JITTimeProfileInfo *this_01;
  ArrayCallSiteInfo *this_02;
  int iVar12;
  undefined6 in_register_00000032;
  TypeId typeId;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_44;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_42;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3e;
  uint32 local_3c;
  uint local_38;
  OpCode local_32 [4];
  OpCode newOpcode_local;
  
  iVar12 = (int)CONCAT62(in_register_00000032,newOpcode);
  local_38 = C1;
  local_32[0] = newOpcode;
  if ((iVar12 != 0xd0) && (iVar12 != 0xe5)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0xb94,
                       "(newOpcode == Js::OpCode::ProfiledNewScArray || newOpcode == Js::OpCode::ProfiledInitForInEnumerator)"
                       ,
                       "newOpcode == Js::OpCode::ProfiledNewScArray || newOpcode == Js::OpCode::ProfiledInitForInEnumerator"
                      );
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(local_32);
  if (local_32[0] == InitForInEnumerator) {
    pRVar8 = BuildSrcOpnd(this,R0,TyVar);
    src2Opnd = BuildForInEnumeratorOpnd(this,local_38,offset);
    pPVar9 = IR::ProfiledInstr::New
                       (InitForInEnumerator,(Opnd *)0x0,&pRVar8->super_Opnd,src2Opnd,this->m_func);
    pPVar10 = IR::Instr::AsProfiledInstr(&pPVar9->super_Instr);
    *(uint *)&pPVar10->u = (uint)profileId;
    AddInstr(this,&pPVar9->super_Instr,offset);
  }
  else {
    local_3c = offset;
    pRVar8 = BuildDstOpnd(this,R0,TyVar,false,false);
    pSVar3 = pRVar8->m_sym;
    src1Opnd = IR::IntConstOpnd::New((long)(int)local_38,TyInt32,this->m_func,false);
    bVar5 = Func::DoSimpleJitDynamicProfile(this->m_func);
    if (bVar5) {
      this_00 = IR::JitProfilingInstr::New
                          (local_32[0],&pRVar8->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
      pJVar11 = IR::Instr::AsJitProfilingInstr(&this_00->super_Instr);
      pJVar11->profileId = profileId;
    }
    else {
      this_00 = (JitProfilingInstr *)
                IR::ProfiledInstr::New
                          (local_32[0],&pRVar8->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
      pPVar9 = IR::Instr::AsProfiledInstr((Instr *)this_00);
      *(uint *)&pPVar9->u = (uint)profileId;
    }
    AddInstr(this,&this_00->super_Instr,local_3c);
    uVar2 = *(uint *)&pSVar3->field_0x18;
    if ((uVar2 & 1) != 0) {
      *(uint *)&pSVar3->field_0x18 = uVar2 | 6;
    }
    bVar5 = Func::HasArrayInfo(this->m_func);
    typeId = TypeIds_Array;
    if (bVar5) {
      this_01 = Func::GetReadOnlyProfileInfo(this->m_func);
      this_02 = JITTimeProfileInfo::GetArrayCallSiteInfo(this_01,profileId);
      if (this_02 != (ArrayCallSiteInfo *)0x0) {
        bVar5 = Func::IsJitInDebugMode(this->m_func);
        if (!bVar5) {
          bVar5 = Js::JavascriptArray::HasInlineHeadSegment(local_38);
          if (bVar5) {
            bVar5 = Js::ArrayCallSiteInfo::IsNativeIntArray(this_02);
            if (bVar5) {
              typeId = TypeIds_NativeIntArray;
            }
            else {
              bVar5 = Js::ArrayCallSiteInfo::IsNativeFloatArray(this_02);
              typeId = (uint)bVar5 + (uint)bVar5 * 2 + TypeIds_Array;
            }
          }
        }
      }
    }
    local_42.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Array);
    local_44.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetHasNoMissingValues((ValueType *)&local_42.field_0,true);
    VVar6 = ValueType::SetArrayTypeId((ValueType *)&local_44.field_0,typeId);
    IR::Opnd::SetValueType(&pRVar8->super_Opnd,VVar6);
    local_40 = (pRVar8->super_Opnd).m_valueType.field_0;
    bVar5 = ValueType::HasVarElements((ValueType *)&local_40.field_0);
    if (bVar5) {
      puVar1 = &(pRVar8->super_Opnd).field_0xb;
      *puVar1 = *puVar1 | 1;
    }
    else {
      local_3e = (pRVar8->super_Opnd).m_valueType.field_0;
      VVar6 = ValueType::ToLikely((ValueType *)&local_3e.field_0);
      IR::Opnd::SetValueType(&pRVar8->super_Opnd,VVar6);
    }
  }
  return;
}

Assistant:

void
IRBuilder::BuildProfiledReg1Unsigned1(Js::OpCode newOpcode, uint32 offset, Js::RegSlot R0, int32 C1, Js::ProfileId profileId)
{
    Assert(newOpcode == Js::OpCode::ProfiledNewScArray || newOpcode == Js::OpCode::ProfiledInitForInEnumerator);
    Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(newOpcode);

    if (newOpcode == Js::OpCode::InitForInEnumerator)
    {
        IR::RegOpnd * src1Opnd = this->BuildSrcOpnd(R0);
        IR::Opnd * src2Opnd = this->BuildForInEnumeratorOpnd(C1, offset);
        IR::Instr *instr = IR::ProfiledInstr::New(Js::OpCode::InitForInEnumerator, nullptr, src1Opnd, src2Opnd, m_func);
        instr->AsProfiledInstr()->u.profileId = profileId;
        this->AddInstr(instr, offset);
        return;
    }

    IR::Instr *instr;
    Js::RegSlot     dstRegSlot = R0;
    IR::RegOpnd *   dstOpnd = this->BuildDstOpnd(dstRegSlot);

    StackSym *      dstSym = dstOpnd->m_sym;
    int32           value = C1;
    IR::IntConstOpnd * srcOpnd;

    srcOpnd = IR::IntConstOpnd::New(value, TyInt32, m_func);
    if (m_func->DoSimpleJitDynamicProfile())
    {
        instr = IR::JitProfilingInstr::New(newOpcode, dstOpnd, srcOpnd, m_func);
        instr->AsJitProfilingInstr()->profileId = profileId;
    }
    else
    {
        instr = IR::ProfiledInstr::New(newOpcode, dstOpnd, srcOpnd, m_func);
        instr->AsProfiledInstr()->u.profileId = profileId;
    }

    this->AddInstr(instr, offset);

    if (dstSym->m_isSingleDef)
    {
        dstSym->m_isSafeThis = true;
        dstSym->m_isNotNumber = true;
    }

    // Undefined values in array literals ([0, undefined, 1]) are treated as missing values in some versions
    Js::ArrayCallSiteInfo *arrayInfo = nullptr;
    if (m_func->HasArrayInfo())
    {
        arrayInfo = m_func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfo(profileId);
    }
    Js::TypeId arrayTypeId = Js::TypeIds_Array;
    if (arrayInfo && !m_func->IsJitInDebugMode() && Js::JavascriptArray::HasInlineHeadSegment(value))
    {
        if (arrayInfo->IsNativeIntArray())
        {
            arrayTypeId = Js::TypeIds_NativeIntArray;
        }
        else if (arrayInfo->IsNativeFloatArray())
        {
            arrayTypeId = Js::TypeIds_NativeFloatArray;
        }
    }
    dstOpnd->SetValueType(ValueType::GetObject(ObjectType::Array).SetHasNoMissingValues(true).SetArrayTypeId(arrayTypeId));
    if (dstOpnd->GetValueType().HasVarElements())
    {
        dstOpnd->SetValueTypeFixed();
    }
    else
    {
        dstOpnd->SetValueType(dstOpnd->GetValueType().ToLikely());
    }
}